

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_tests.cpp
# Opt level: O2

void __thiscall hash_tests::murmurhash3::test_method(murmurhash3 *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  uint *puVar2;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> vDataToHash;
  const_string file_00;
  Span<const_unsigned_char> vDataToHash_00;
  const_string file_01;
  Span<const_unsigned_char> vDataToHash_01;
  const_string file_02;
  string_view hex_str;
  Span<const_unsigned_char> vDataToHash_02;
  const_string file_03;
  string_view hex_str_00;
  Span<const_unsigned_char> vDataToHash_03;
  const_string file_04;
  string_view hex_str_01;
  Span<const_unsigned_char> vDataToHash_04;
  const_string file_05;
  string_view hex_str_02;
  Span<const_unsigned_char> vDataToHash_05;
  const_string file_06;
  string_view hex_str_03;
  Span<const_unsigned_char> vDataToHash_06;
  const_string file_07;
  string_view hex_str_04;
  Span<const_unsigned_char> vDataToHash_07;
  const_string file_08;
  string_view hex_str_05;
  Span<const_unsigned_char> vDataToHash_08;
  const_string file_09;
  string_view hex_str_06;
  Span<const_unsigned_char> vDataToHash_09;
  const_string file_10;
  string_view hex_str_07;
  Span<const_unsigned_char> vDataToHash_10;
  const_string file_11;
  string_view hex_str_08;
  Span<const_unsigned_char> vDataToHash_11;
  const_string file_12;
  string_view hex_str_09;
  Span<const_unsigned_char> vDataToHash_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined4 local_ac;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  uint local_8c;
  char *local_88;
  char *local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1d;
  file.m_begin = (iterator)&local_48;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_80 = "";
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
             (string_view)(ZEXT816(0xba928e) << 0x40));
  vDataToHash.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash);
  puVar2 = &local_8c;
  local_ac = 0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_88,0x1d,1,2,puVar2,"MurmurHash3(0x00000000, ParseHex(\"\"))",&local_ac
             ,"0x00000000U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1e;
  file_00.m_begin = (iterator)&local_c0;
  msg_00.m_end = (iterator)puVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_d8 = "";
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
             (string_view)(ZEXT816(0xba928e) << 0x40));
  vDataToHash_00.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_00.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0xfba4c795,vDataToHash_00);
  puVar2 = &local_8c;
  local_ac = 0x6a396f08;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_e0,0x1e,1,2,puVar2,"MurmurHash3(0xFBA4C795, ParseHex(\"\"))",&local_ac
             ,"0x6a396f08U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1f;
  file_01.m_begin = (iterator)&local_f0;
  msg_01.m_end = (iterator)puVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_100,
             msg_01);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_108 = "";
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
             (string_view)(ZEXT816(0xba928e) << 0x40));
  vDataToHash_01.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_01.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0xffffffff,vDataToHash_01);
  puVar2 = &local_8c;
  local_ac = 0x81f16f39;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_110,0x1f,1,2,puVar2,"MurmurHash3(0xffffffff, ParseHex(\"\"))",
             &local_ac,"0x81f16f39U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x21;
  file_02.m_begin = (iterator)&local_120;
  msg_02.m_end = (iterator)puVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
             msg_02);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_138 = "";
  hex_str._M_str = "00";
  hex_str._M_len = 2;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str);
  vDataToHash_02.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_02.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_02);
  puVar2 = &local_8c;
  local_ac = 0x514e28b7;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_140,0x21,1,2,puVar2,"MurmurHash3(0x00000000, ParseHex(\"00\"))",
             &local_ac,"0x514e28b7U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = &DAT_00000022;
  file_03.m_begin = (iterator)&local_150;
  msg_03.m_end = (iterator)puVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_160,
             msg_03);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_168 = "";
  hex_str_00._M_str = "00";
  hex_str_00._M_len = 2;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_00);
  vDataToHash_03.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_03.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0xfba4c795,vDataToHash_03);
  puVar2 = &local_8c;
  local_ac = 0xea3f0b17;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_170,0x22,1,2,puVar2,"MurmurHash3(0xFBA4C795, ParseHex(\"00\"))",
             &local_ac,"0xea3f0b17U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x23;
  file_04.m_begin = (iterator)&local_180;
  msg_04.m_end = (iterator)puVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_190,
             msg_04);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_198 = "";
  hex_str_01._M_str = "ff";
  hex_str_01._M_len = 2;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_01);
  vDataToHash_04.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_04.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_04);
  puVar2 = &local_8c;
  local_ac = 0xfd6cf10d;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_1a0,0x23,1,2,puVar2,"MurmurHash3(0x00000000, ParseHex(\"ff\"))",
             &local_ac,"0xfd6cf10dU");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x25;
  file_05.m_begin = (iterator)&local_1b0;
  msg_05.m_end = (iterator)puVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c0,
             msg_05);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_1c8 = "";
  hex_str_02._M_str = "0011";
  hex_str_02._M_len = 4;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_02);
  vDataToHash_05.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_05.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_05);
  puVar2 = &local_8c;
  local_ac = 0x16c6b7ab;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_1d0,0x25,1,2,puVar2,"MurmurHash3(0x00000000, ParseHex(\"0011\"))",
             &local_ac,"0x16c6b7abU");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x26;
  file_06.m_begin = (iterator)&local_1e0;
  msg_06.m_end = (iterator)puVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f0,
             msg_06);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_1f8 = "";
  hex_str_03._M_str = "001122";
  hex_str_03._M_len = 6;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_03);
  vDataToHash_06.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_06.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_06);
  puVar2 = &local_8c;
  local_ac = 0x8eb51c3d;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_200,0x26,1,2,puVar2,"MurmurHash3(0x00000000, ParseHex(\"001122\"))",
             &local_ac,"0x8eb51c3dU");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x27;
  file_07.m_begin = (iterator)&local_210;
  msg_07.m_end = (iterator)puVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_220,
             msg_07);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_228 = "";
  hex_str_04._M_str = "00112233";
  hex_str_04._M_len = 8;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_04);
  vDataToHash_07.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_07.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_07);
  puVar2 = &local_8c;
  local_ac = 0xb4471bf8;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_230,0x27,1,2,puVar2,"MurmurHash3(0x00000000, ParseHex(\"00112233\"))",
             &local_ac,"0xb4471bf8U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = &DAT_00000028;
  file_08.m_begin = (iterator)&local_240;
  msg_08.m_end = (iterator)puVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_250,
             msg_08);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_258 = "";
  hex_str_05._M_str = "0011223344";
  hex_str_05._M_len = 10;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_05);
  vDataToHash_08.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_08.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_08);
  puVar2 = &local_8c;
  local_ac = 0xe2301fa8;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_260,0x28,1,2,puVar2,
             "MurmurHash3(0x00000000, ParseHex(\"0011223344\"))",&local_ac,"0xe2301fa8U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x29;
  file_09.m_begin = (iterator)&local_270;
  msg_09.m_end = (iterator)puVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_280,
             msg_09);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_288 = "";
  hex_str_06._M_str = "001122334455";
  hex_str_06._M_len = 0xc;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_06);
  vDataToHash_09.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_09.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_09);
  puVar2 = &local_8c;
  local_ac = 0xfc2e4a15;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_290,0x29,1,2,puVar2,
             "MurmurHash3(0x00000000, ParseHex(\"001122334455\"))",&local_ac,"0xfc2e4a15U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2a;
  file_10.m_begin = (iterator)&local_2a0;
  msg_10.m_end = (iterator)puVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2b0,
             msg_10);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_2b8 = "";
  hex_str_07._M_str = "00112233445566";
  hex_str_07._M_len = 0xe;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_07);
  vDataToHash_10.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_10.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_10);
  puVar2 = &local_8c;
  local_ac = 0xb074502c;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_2c0,0x2a,1,2,puVar2,
             "MurmurHash3(0x00000000, ParseHex(\"00112233445566\"))",&local_ac,"0xb074502cU");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x2b;
  file_11.m_begin = (iterator)&local_2d0;
  msg_11.m_end = (iterator)puVar2;
  msg_11.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2e0,
             msg_11);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_2e8 = "";
  hex_str_08._M_str = "0011223344556677";
  hex_str_08._M_len = 0x10;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_08);
  vDataToHash_11.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_11.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_11);
  puVar2 = &local_8c;
  local_ac = 0x8034d2a0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_2f0,0x2b,1,2,puVar2,
             "MurmurHash3(0x00000000, ParseHex(\"0011223344556677\"))",&local_ac,"0x8034d2a0U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x2c;
  file_12.m_begin = (iterator)&local_300;
  msg_12.m_end = (iterator)puVar2;
  msg_12.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_310,
             msg_12);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_318 = "";
  hex_str_09._M_str = "001122334455667788";
  hex_str_09._M_len = 0x12;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,hex_str_09);
  vDataToHash_12.m_size =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  vDataToHash_12.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_8c = MurmurHash3(0,vDataToHash_12);
  local_ac = 0xb4698def;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_78,&local_320,0x2c,1,2,&local_8c,
             "MurmurHash3(0x00000000, ParseHex(\"001122334455667788\"))",&local_ac,"0xb4698defU");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(murmurhash3)
{

#define T(expected, seed, data) BOOST_CHECK_EQUAL(MurmurHash3(seed, ParseHex(data)), expected)

    // Test MurmurHash3 with various inputs. Of course this is retested in the
    // bloom filter tests - they would fail if MurmurHash3() had any problems -
    // but is useful for those trying to implement Bitcoin libraries as a
    // source of test data for their MurmurHash3() primitive during
    // development.
    //
    // The magic number 0xFBA4C795 comes from CBloomFilter::Hash()

    T(0x00000000U, 0x00000000, "");
    T(0x6a396f08U, 0xFBA4C795, "");
    T(0x81f16f39U, 0xffffffff, "");

    T(0x514e28b7U, 0x00000000, "00");
    T(0xea3f0b17U, 0xFBA4C795, "00");
    T(0xfd6cf10dU, 0x00000000, "ff");

    T(0x16c6b7abU, 0x00000000, "0011");
    T(0x8eb51c3dU, 0x00000000, "001122");
    T(0xb4471bf8U, 0x00000000, "00112233");
    T(0xe2301fa8U, 0x00000000, "0011223344");
    T(0xfc2e4a15U, 0x00000000, "001122334455");
    T(0xb074502cU, 0x00000000, "00112233445566");
    T(0x8034d2a0U, 0x00000000, "0011223344556677");
    T(0xb4698defU, 0x00000000, "001122334455667788");

#undef T
}